

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult aa64_zva_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = (uint)env->features;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar2 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar4 = uVar2 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar3 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar4)) goto LAB_0061fdd3;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061fdd3:
  if (1 < uVar3) {
    return CP_ACCESS_OK;
  }
  uVar1 = arm_hcr_el2_eff_aarch64(env);
  if (uVar3 == 0) {
    if ((~uVar1 & 0x408000000) == 0) {
      if ((*(byte *)((long)&(env->cp15).field_2 + 0x11) & 0x40) != 0) goto LAB_0061fdea;
      goto LAB_0061fe2b;
    }
    if ((undefined1  [32])((undefined1  [32])(env->cp15).field_2 & (undefined1  [32])0x4000) !=
        (undefined1  [32])0x0) goto LAB_0061fde4;
    uVar1 = 1;
  }
  else {
LAB_0061fde4:
    if (((uint)uVar1 >> 0x1c & 1) == 0) {
LAB_0061fdea:
      bVar4 = true;
      goto LAB_0061fe32;
    }
LAB_0061fe2b:
    uVar1 = 3;
  }
  bVar4 = false;
LAB_0061fe32:
  if (bVar4) {
    return CP_ACCESS_OK;
  }
  return (CPAccessResult)uVar1;
}

Assistant:

static CPAccessResult aa64_zva_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TDZ) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TDZ) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}